

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int cigar_iref2iseq_set(uint32_t **cigar,uint32_t *cigar_max,int *icig,int *iseq,int *iref)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  
  iVar5 = *iref;
  if (-1 < iVar5) {
    *icig = 0;
    *iseq = 0;
    *iref = 0;
    puVar6 = *cigar;
    while (puVar6 < cigar_max) {
      uVar1 = *puVar6;
      uVar4 = uVar1 & 0xf;
      uVar3 = uVar1 >> 4;
      if (uVar4 == 4) {
LAB_00113d97:
        puVar6 = puVar6 + 1;
        *cigar = puVar6;
        *iseq = *iseq + uVar3;
        *icig = 0;
      }
      else if (uVar4 - 5 < 2) {
        puVar6 = puVar6 + 1;
        *cigar = puVar6;
        *icig = 0;
      }
      else {
        if (((uVar1 & 7) == 0) || (uVar4 == 7)) {
          if ((int)(iVar5 - uVar3) < 0) {
            *icig = iVar5;
            *iseq = *iseq + iVar5;
            *iref = *iref + *icig;
            return 0;
          }
          *cigar = puVar6 + 1;
          *iseq = *iseq + uVar3;
          *icig = 0;
          iVar2 = *iref;
          iVar5 = iVar5 - uVar3;
        }
        else {
          if (uVar4 == 1) goto LAB_00113d97;
          if ((uVar1 & 0xe) != 2) {
            fprintf(_stderr,"todo: cigar %d\n",(ulong)uVar4);
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/sam.c"
                          ,0x5ee,
                          "int cigar_iref2iseq_set(uint32_t **, uint32_t *, int *, int *, int *)");
          }
          iVar5 = iVar5 - uVar3;
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          *cigar = puVar6 + 1;
          *icig = 0;
          iVar2 = *iref;
        }
        puVar6 = puVar6 + 1;
        *iref = uVar3 + iVar2;
      }
    }
    *iseq = -1;
  }
  return -1;
}

Assistant:

static inline int cigar_iref2iseq_set(uint32_t **cigar, uint32_t *cigar_max, int *icig, int *iseq, int *iref)
{
    int pos = *iref;
    if ( pos < 0 ) return -1;
    *icig = 0;
    *iseq = 0;
    *iref = 0;
    while ( *cigar<cigar_max )
    {
        int cig  = (**cigar) & BAM_CIGAR_MASK;
        int ncig = (**cigar) >> BAM_CIGAR_SHIFT;

        if ( cig==BAM_CSOFT_CLIP ) { (*cigar)++; *iseq += ncig; *icig = 0; continue; }
        if ( cig==BAM_CHARD_CLIP || cig==BAM_CPAD ) { (*cigar)++; *icig = 0; continue; }
        if ( cig==BAM_CMATCH || cig==BAM_CEQUAL || cig==BAM_CDIFF )
        {
            pos -= ncig;
            if ( pos < 0 ) { *icig = ncig + pos; *iseq += *icig; *iref += *icig; return BAM_CMATCH; }
            (*cigar)++; *iseq += ncig; *icig = 0; *iref += ncig;
            continue;
        }
        if ( cig==BAM_CINS ) { (*cigar)++; *iseq += ncig; *icig = 0; continue; }
        if ( cig==BAM_CDEL || cig==BAM_CREF_SKIP )
        {
            pos -= ncig;
            if ( pos<0 ) pos = 0;
            (*cigar)++; *icig = 0; *iref += ncig;
            continue;
        }
        fprintf(stderr,"todo: cigar %d\n", cig);
        assert(0);
    }
    *iseq = -1;
    return -1;
}